

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

void bidiag_orth(double *A,int M,int N,double *U,double *V)

{
  size_t __size;
  int iVar1;
  int n;
  uint uVar2;
  long lVar3;
  double *x;
  double *v;
  double *A_00;
  double *C;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int N_00;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  double dVar25;
  long local_e0;
  double *local_d0;
  double *local_c8;
  long local_a0;
  int local_84;
  double *local_80;
  double *local_78;
  
  if (M < N) {
    printf("M should be greater than or equal to N");
    exit(1);
  }
  lVar3 = (long)M;
  __size = lVar3 * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  A_00 = (double *)malloc(__size * lVar3);
  C = (double *)malloc(__size * lVar3);
  eye(U,M);
  eye(V,N);
  lVar21 = (long)N;
  uVar19 = 0;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  uVar24 = (ulong)(uint)M;
  uVar20 = (ulong)(uint)N;
  local_e0 = lVar21 << 0x20;
  iVar15 = 2;
  iVar1 = -1;
  local_84 = 1;
  uVar22 = uVar24;
  pdVar9 = x;
  local_d0 = A;
  local_c8 = v;
  local_80 = U;
  local_78 = A;
  local_a0 = local_e0;
  while( true ) {
    local_a0 = local_a0 + -0x100000000;
    pdVar9 = pdVar9 + -1;
    uVar12 = (uint)uVar19;
    n = M - uVar12;
    uVar2 = uVar12;
    if (n != 0 && (int)uVar12 <= M) {
      uVar2 = M;
    }
    if (uVar19 == uVar4) break;
    lVar10 = (long)local_84;
    lVar5 = (ulong)(uint)(iVar1 + local_84) << 0x20;
    pdVar6 = (double *)(lVar21 * 8 * lVar10 + (long)local_d0);
    lVar13 = (long)iVar15;
    pdVar8 = local_78;
    for (uVar11 = 0; uVar22 != uVar11; uVar11 = uVar11 + 1) {
      x[uVar11] = *pdVar8;
      pdVar8 = pdVar8 + lVar21;
    }
    N_00 = M - uVar12;
    dVar25 = house(x,N_00,v);
    uVar11 = (ulong)uVar2;
    lVar7 = 0;
    pdVar8 = local_78;
    for (uVar14 = uVar19; uVar14 != uVar11; uVar14 = uVar14 + 1) {
      lVar16 = lVar7;
      for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
        *(double *)((long)A_00 + (lVar16 >> 0x1d)) = pdVar8[uVar17];
        lVar16 = lVar16 + (uVar22 << 0x20);
      }
      pdVar8 = pdVar8 + lVar21;
      lVar7 = lVar7 + 0x100000000;
    }
    iVar23 = N - uVar12;
    mmult(A_00,v,C,iVar23,n,1);
    scale(C,iVar23,1,dVar25);
    mmult(v,C,A_00,n,1,iVar23);
    lVar7 = 0;
    pdVar8 = local_78;
    for (uVar14 = uVar19; lVar16 = lVar10, uVar14 != uVar11; uVar14 = uVar14 + 1) {
      lVar16 = lVar7;
      for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
        pdVar8[uVar17] = pdVar8[uVar17] - *(double *)((long)A_00 + (lVar16 >> 0x1d));
        lVar16 = lVar16 + 0x100000000;
      }
      pdVar8 = pdVar8 + lVar21;
      lVar7 = lVar7 + local_e0;
    }
    for (; lVar16 < lVar3; lVar16 = lVar16 + 1) {
      *pdVar6 = local_c8[lVar16];
      pdVar6 = pdVar6 + lVar21;
    }
    lVar7 = 0;
    pdVar8 = local_80;
    for (uVar14 = uVar19; uVar14 != uVar11; uVar14 = uVar14 + 1) {
      for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
        A_00[(int)lVar7 + (int)uVar17] = pdVar8[uVar17];
      }
      pdVar8 = pdVar8 + lVar3;
      lVar7 = lVar7 + uVar22;
    }
    mmult(A_00,v,C,N_00,N_00,1);
    scale(C,N_00,1,dVar25);
    mmult(C,v,A_00,N_00,1,N_00);
    lVar7 = 0;
    pdVar8 = local_80;
    for (uVar11 = uVar19; uVar11 != uVar24; uVar11 = uVar11 + 1) {
      for (uVar14 = 0; uVar22 != uVar14; uVar14 = uVar14 + 1) {
        pdVar8[uVar14] = pdVar8[uVar14] - A_00[(int)lVar7 + (int)uVar14];
      }
      pdVar8 = pdVar8 + lVar3;
      lVar7 = lVar7 + uVar22;
    }
    lVar7 = lVar10;
    if ((long)uVar19 < (long)(N + -2)) {
      for (; lVar7 < lVar21; lVar7 = lVar7 + 1) {
        pdVar9[lVar7] = A[lVar7];
      }
      iVar23 = iVar23 + -1;
      dVar25 = house(x,iVar23,v);
      lVar7 = lVar5;
      pdVar8 = A;
      for (uVar11 = uVar19; lVar16 = lVar7, lVar18 = lVar10, uVar11 != uVar24; uVar11 = uVar11 + 1)
      {
        for (; lVar18 < lVar21; lVar18 = lVar18 + 1) {
          *(double *)((long)A_00 + (lVar16 >> 0x1d)) = pdVar8[lVar18];
          lVar16 = lVar16 + 0x100000000;
        }
        pdVar8 = pdVar8 + lVar21;
        lVar7 = lVar7 + local_a0;
      }
      mmult(A_00,v,C,n,iVar23,1);
      scale(C,N_00,1,dVar25);
      mmult(C,v,A_00,n,1,iVar23);
      pdVar8 = A;
      for (uVar11 = uVar19; lVar7 = lVar5, lVar16 = lVar10, pdVar6 = v, uVar11 != uVar24;
          uVar11 = uVar11 + 1) {
        for (; lVar16 < lVar21; lVar16 = lVar16 + 1) {
          pdVar8[lVar16] = pdVar8[lVar16] - *(double *)((long)A_00 + (lVar7 >> 0x1d));
          lVar7 = lVar7 + 0x100000000;
        }
        pdVar8 = pdVar8 + lVar21;
        lVar5 = lVar5 + local_a0;
      }
      for (; lVar13 < lVar21; lVar13 = lVar13 + 1) {
        A[lVar13] = pdVar6[1];
        pdVar6 = pdVar6 + 1;
      }
    }
    uVar19 = uVar19 + 1;
    uVar22 = uVar22 - 1;
    local_84 = local_84 + 1;
    iVar15 = iVar15 + 1;
    local_78 = local_78 + lVar21 + 1;
    uVar20 = uVar20 - 1;
    local_e0 = local_e0 + -0x100000000;
    local_c8 = local_c8 + -1;
    local_d0 = local_d0 + 1;
    local_80 = local_80 + lVar3 + 1;
    A = A + lVar21;
    iVar1 = iVar1 + -1;
  }
  free(x);
  free(v);
  free(A_00);
  return;
}

Assistant:

void bidiag_orth(double *A, int M, int N,double *U,double *V) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * M);
	w = (double*) malloc(sizeof(double) * M * M);


	eye(U,M);
	eye(V,N);

	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);
		//mdisplay(v,M-j,1);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}


		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				AT[u+k-j] = U[k+t];
			}
		}

		mmult(AT,v,w,M-j,M-j,1);
		scale(w,M-j,1,beta);
		mmult(w,v,AT,M-j,1,M-j);

		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				U[k+t] -= AT[u+k-j];
			}
		}

		//mdisplay(U,M,M);

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}